

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

size_t __thiscall slang::SourceManager::getLineNumber(SourceManager *this,SourceLocation location)

{
  SourceLocation location_00;
  size_t rawLineNumber;
  FileInfo *this_00;
  LineDirectiveInfo *pLVar1;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  location_00 = getFullyExpandedLoc(this,location);
  rawLineNumber = getRawLineNumber(this,location_00);
  if (rawLineNumber == 0) {
    rawLineNumber = 0;
  }
  else {
    this_00 = getFileInfo(this,(BufferID)(location_00._0_4_ & 0xfffffff));
    local_28._M_owns = true;
    local_28._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pLVar1 = FileInfo::getPreviousLineDirective(this_00,rawLineNumber);
    if (pLVar1 != (LineDirectiveInfo *)0x0) {
      rawLineNumber = rawLineNumber + pLVar1->lineOfDirective + ~pLVar1->lineInFile;
    }
    std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  }
  return rawLineNumber;
}

Assistant:

size_t SourceManager::getLineNumber(SourceLocation location) const {
    SourceLocation fileLocation = getFullyExpandedLoc(location);
    size_t rawLineNumber = getRawLineNumber(fileLocation);
    if (rawLineNumber == 0)
        return 0;

    auto info = getFileInfo(fileLocation.buffer());

    std::shared_lock lock(mut);
    auto lineDirective = info->getPreviousLineDirective(rawLineNumber);
    if (!lineDirective)
        return rawLineNumber;
    else
        return lineDirective->lineOfDirective + (rawLineNumber - lineDirective->lineInFile) - 1;
}